

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_ctc1_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1,uint32_t fs,uint32_t rt)

{
  uint uVar1;
  uintptr_t unaff_retaddr;
  uint32_t rt_local;
  uint32_t fs_local;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  uVar1 = (uint)arg1;
  switch(fs) {
  case 1:
    if (((env->active_fpu).fcr0 & 0x10000000) == 0) {
      return;
    }
    if (rt != 0) {
      return;
    }
    if ((env->CP0_Config5 & 4U) == 0) {
      do_raise_exception(env,0x14,unaff_retaddr);
    }
    env->CP0_Status = env->CP0_Status & 0xfbffffff;
    compute_hflags(env);
    break;
  default:
    if ((env->insn_flags & 0x2000) == 0) {
      return;
    }
    do_raise_exception(env,0x14,unaff_retaddr);
  case 4:
    if (((env->active_fpu).fcr0 & 0x10000000) == 0) {
      return;
    }
    if (rt != 0) {
      return;
    }
    if ((env->CP0_Config5 & 4U) == 0) {
      do_raise_exception(env,0x14,unaff_retaddr);
    }
    env->CP0_Status = env->CP0_Status | 0x4000000;
    compute_hflags(env);
    break;
  case 5:
    if (((env->active_fpu).fcr0 & 0x20000000) == 0) {
      return;
    }
    if (rt != 0) {
      return;
    }
    if ((env->CP0_Config5 & 0x200U) == 0) {
      helper_raise_exception_mips64(env,0x14);
    }
    env->CP0_Config5 = env->CP0_Config5 & 0xfffffeff;
    compute_hflags(env);
    break;
  case 6:
    if (((env->active_fpu).fcr0 & 0x20000000) == 0) {
      return;
    }
    if (rt != 0) {
      return;
    }
    if ((env->CP0_Config5 & 0x200U) == 0) {
      helper_raise_exception_mips64(env,0x14);
    }
    env->CP0_Config5 = env->CP0_Config5 | 0x100;
    compute_hflags(env);
    break;
  case 0x19:
    if ((env->insn_flags & 0x2000) != 0) {
      return;
    }
    if ((arg1 & 0xffffff00) != 0) {
      return;
    }
    (env->active_fpu).fcr31 =
         (env->active_fpu).fcr31 & 0x17fffff | (uint)((arg1 & 0xfe) << 0x18) |
         (uint)((arg1 & 1) << 0x17);
    break;
  case 0x1a:
    if ((arg1 & 0x7c0000) != 0) {
      return;
    }
    (env->active_fpu).fcr31 = (env->active_fpu).fcr31 & 0xfffc0f83 | uVar1 & 0x3f07c;
    break;
  case 0x1c:
    if ((arg1 & 0x7c0000) != 0) {
      return;
    }
    (env->active_fpu).fcr31 =
         (env->active_fpu).fcr31 & 0xfefff07c | uVar1 & 0xf83 | (uint)((arg1 & 4) << 0x16);
    break;
  case 0x1f:
    (env->active_fpu).fcr31 =
         uVar1 & (env->active_fpu).fcr31_rw_bitmask |
         (env->active_fpu).fcr31 & ((env->active_fpu).fcr31_rw_bitmask ^ 0xffffffff);
  }
  restore_fp_status(env);
  set_float_exception_flags(0,&(env->active_fpu).fp_status);
  if ((((env->active_fpu).fcr31 >> 7 & 0x1f | 0x20) & (env->active_fpu).fcr31 >> 0xc & 0x3f) == 0) {
    return;
  }
  do_raise_exception(env,0x17,unaff_retaddr);
}

Assistant:

void helper_ctc1(CPUMIPSState *env, target_ulong arg1, uint32_t fs, uint32_t rt)
{
    switch (fs) {
    case 1:
        /* UFR Alias - Reset Status FR */
        if (!((env->active_fpu.fcr0 & (1 << FCR0_UFRP)) && (rt == 0))) {
            return;
        }
        if (env->CP0_Config5 & (1 << CP0C5_UFR)) {
            env->CP0_Status &= ~(1 << CP0St_FR);
            compute_hflags(env);
        } else {
            do_raise_exception(env, EXCP_RI, GETPC());
        }
        break;
    case 4:
        /* UNFR Alias - Set Status FR */
        if (!((env->active_fpu.fcr0 & (1 << FCR0_UFRP)) && (rt == 0))) {
            return;
        }
        if (env->CP0_Config5 & (1 << CP0C5_UFR)) {
            env->CP0_Status |= (1 << CP0St_FR);
            compute_hflags(env);
        } else {
            do_raise_exception(env, EXCP_RI, GETPC());
        }
        break;
    case 5:
        /* FRE Support - clear Config5.FRE bit */
        if (!((env->active_fpu.fcr0 & (1 << FCR0_FREP)) && (rt == 0))) {
            return;
        }
        if (env->CP0_Config5 & (1 << CP0C5_UFE)) {
            env->CP0_Config5 &= ~(1 << CP0C5_FRE);
            compute_hflags(env);
        } else {
            helper_raise_exception(env, EXCP_RI);
        }
        break;
    case 6:
        /* FRE Support - set Config5.FRE bit */
        if (!((env->active_fpu.fcr0 & (1 << FCR0_FREP)) && (rt == 0))) {
            return;
        }
        if (env->CP0_Config5 & (1 << CP0C5_UFE)) {
            env->CP0_Config5 |= (1 << CP0C5_FRE);
            compute_hflags(env);
        } else {
            helper_raise_exception(env, EXCP_RI);
        }
        break;
    case 25:
        if ((env->insn_flags & ISA_MIPS32R6) || (arg1 & 0xffffff00)) {
            return;
        }
        env->active_fpu.fcr31 = (env->active_fpu.fcr31 & 0x017fffff) |
                                ((arg1 & 0xfe) << 24) |
                                ((arg1 & 0x1) << 23);
        break;
    case 26:
        if (arg1 & 0x007c0000) {
            return;
        }
        env->active_fpu.fcr31 = (env->active_fpu.fcr31 & 0xfffc0f83) |
                                (arg1 & 0x0003f07c);
        break;
    case 28:
        if (arg1 & 0x007c0000) {
            return;
        }
        env->active_fpu.fcr31 = (env->active_fpu.fcr31 & 0xfefff07c) |
                                (arg1 & 0x00000f83) |
                                ((arg1 & 0x4) << 22);
        break;
    case 31:
        env->active_fpu.fcr31 = (arg1 & env->active_fpu.fcr31_rw_bitmask) |
               (env->active_fpu.fcr31 & ~(env->active_fpu.fcr31_rw_bitmask));
        break;
    default:
        if (env->insn_flags & ISA_MIPS32R6) {
            do_raise_exception(env, EXCP_RI, GETPC());
        }
        return;
    }
    restore_fp_status(env);
    set_float_exception_flags(0, &env->active_fpu.fp_status);
    if ((GET_FP_ENABLE(env->active_fpu.fcr31) | 0x20) &
        GET_FP_CAUSE(env->active_fpu.fcr31)) {
        do_raise_exception(env, EXCP_FPE, GETPC());
    }
}